

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O0

void __thiscall Imaginer::Utils::iRpn::iRpn(iRpn *this)

{
  iStack<char> *this_00;
  iStack<Imaginer::Utils::iRpn::RPNnode> *this_01;
  int local_2c;
  char local_25 [17];
  int local_14;
  iRpn *local_10;
  iRpn *this_local;
  
  this->_expnames = (char *)0x0;
  this->_curpos = 0;
  local_10 = this;
  this_00 = (iStack<char> *)operator_new(0x10);
  local_14 = 0x400;
  iStack<char>::iStack(this_00,&local_14);
  this->_operator = this_00;
  local_25[0] = '#';
  iStack<char>::push(this->_operator,local_25);
  this_01 = (iStack<Imaginer::Utils::iRpn::RPNnode> *)operator_new(0x10);
  local_2c = 0x400;
  iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(this_01,&local_2c);
  this->_operands = this_01;
  return;
}

Assistant:

iRpn::iRpn():_expnames(NULL),_curpos(0)
{
    _operator = new iStack<char>;
    _operator->push('#');
    _operands = new iStack<RPNnode>;
}